

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O2

size_t baryonyx::memory_consumed(problem *pb)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar1 = string_buffer::size((pb->strings).
                              super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
  sVar2 = anon_unknown.dwarf_133fdfc::memory_consumed(&pb->objective);
  sVar3 = anon_unknown.dwarf_133fdfc::memory_consumed(&pb->equal_constraints);
  sVar4 = anon_unknown.dwarf_133fdfc::memory_consumed(&pb->greater_constraints);
  sVar5 = anon_unknown.dwarf_133fdfc::memory_consumed(&pb->less_constraints);
  return (size_t)((pb->affected_vars).values.
                  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage +
                 (long)(pb->vars).values.
                       super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage +
                 ((sVar5 + sVar3 + sVar2 + sVar4 + sVar1 * 0x100000) -
                 (long)((pb->affected_vars).values.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_start +
                       (long)&((pb->vars).values.
                               super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                               ._M_impl.super__Vector_impl_data._M_start)->min)) + 0x158);
}

Assistant:

std::size_t
memory_consumed(const problem& pb) noexcept
{
    auto ret = sizeof(problem);

    ret += pb.strings->size() * string_buffer::string_buffer_node_length;
    ret += ::memory_consumed(pb.objective);
    ret += ::memory_consumed(pb.equal_constraints);
    ret += ::memory_consumed(pb.greater_constraints);
    ret += ::memory_consumed(pb.less_constraints);
    ret += ::memory_consumed(pb.vars);
    ret += ::memory_consumed(pb.affected_vars);

    return ret;
}